

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int ingrouping(lys_node *node)

{
  for (; (node != (lys_node *)0x0 && (node->nodetype != LYS_GROUPING)); node = lys_parent(node)) {
  }
  return (int)(node != (lys_node *)0x0);
}

Assistant:

static int
ingrouping(const struct lys_node *node)
{
    const struct lys_node *iter = node;
    assert(node);

    for(iter = node; iter && iter->nodetype != LYS_GROUPING; iter = lys_parent(iter));
    if (!iter) {
        return 0;
    } else {
        return 1;
    }
}